

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderFunctionTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::anon_unknown_0::imul_extended_invalid_y
               (NegativeTestContext *ctx)

{
  ShaderType shaderType;
  ShaderFunction function;
  bool bVar1;
  char *__s;
  long lVar2;
  DataType in_stack_ffffffffffffff18;
  allocator<char> local_e1;
  long local_e0;
  long local_d8;
  string shaderSource;
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&shaderSource,"imulExtended: Invalid y type.",(allocator<char> *)&local_90);
  NegativeTestContext::beginSection(ctx,&shaderSource);
  std::__cxx11::string::~string((string *)&shaderSource);
  for (lVar2 = 0; lVar2 != 6; lVar2 = lVar2 + 1) {
    shaderType = (&NegativeTestShared::(anonymous_namespace)::s_shaders)[lVar2];
    bVar1 = NegativeTestContext::isShaderSupported(ctx,shaderType);
    if (bVar1) {
      local_d8 = lVar2;
      __s = glu::getShaderTypeName(shaderType);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,__s,&local_e1);
      std::operator+(&shaderSource,"Verify shader: ",&local_90);
      NegativeTestContext::beginSection(ctx,&shaderSource);
      std::__cxx11::string::~string((string *)&shaderSource);
      std::__cxx11::string::~string((string *)&local_90);
      lVar2 = 0;
      while (lVar2 != 4) {
        function = deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes[lVar2];
        local_e0 = lVar2;
        NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST|SHADERTYPE_FRAGMENT,
                   function,deqp::gles2::Performance::ShaderOperatorTests::init()::floatTypes[lVar2]
                   ,function,function,in_stack_ffffffffffffff18);
        std::__cxx11::string::string((string *)&local_b0,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&shaderSource);
        NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                  (&shaderSource,(_anonymous_namespace_ *)ctx,
                   (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST|SHADERTYPE_FRAGMENT,
                   function,deqp::gles3::Functional::ShaderOperatorTests::init()::s_uintTypes
                            [local_e0],function,function,in_stack_ffffffffffffff18);
        std::__cxx11::string::string((string *)&local_50,(string *)&shaderSource);
        verifyShader(ctx,shaderType,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        std::__cxx11::string::~string((string *)&shaderSource);
        for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
          if (*(ShaderFunction *)
               ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::intTypes + lVar2) !=
              function) {
            NegativeTestShared::(anonymous_namespace)::genShaderSourceMulExtended_abi_cxx11_
                      (&shaderSource,(_anonymous_namespace_ *)ctx,
                       (NegativeTestContext *)(ulong)shaderType,SHADERTYPE_LAST|SHADERTYPE_FRAGMENT,
                       function,*(ShaderFunction *)
                                 ((long)deqp::gles2::Performance::ShaderOperatorTests::init()::
                                        intTypes + lVar2),function,function,
                       in_stack_ffffffffffffff18);
            std::__cxx11::string::string((string *)&local_70,(string *)&shaderSource);
            verifyShader(ctx,shaderType,&local_70);
            std::__cxx11::string::~string((string *)&local_70);
            std::__cxx11::string::~string((string *)&shaderSource);
          }
        }
        lVar2 = local_e0 + 1;
      }
      NegativeTestContext::endSection(ctx);
      lVar2 = local_d8;
    }
  }
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void imul_extended_invalid_y (NegativeTestContext& ctx)
{
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_uintTypes));
	DE_ASSERT(DE_LENGTH_OF_ARRAY(s_floatTypes) == DE_LENGTH_OF_ARRAY(s_intTypes));

	ctx.beginSection("imulExtended: Invalid y type.");
	for (int shaderNdx = 0; shaderNdx < DE_LENGTH_OF_ARRAY(s_shaders); ++shaderNdx)
	{
		if (ctx.isShaderSupported(s_shaders[shaderNdx]))
		{
			ctx.beginSection("Verify shader: " + std::string(getShaderTypeName(s_shaders[shaderNdx])));
			for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx)
			{
				{
					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_IMUL_EXTENDED, s_intTypes[dataTypeNdx], s_floatTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
				{
					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_IMUL_EXTENDED, s_intTypes[dataTypeNdx], s_uintTypes[dataTypeNdx], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}

				for (int dataTypeNdx2 = 0; dataTypeNdx2 < DE_LENGTH_OF_ARRAY(s_intTypes); ++dataTypeNdx2)
				{
					if (s_intTypes[dataTypeNdx2] == s_intTypes[dataTypeNdx])
						continue;

					const std::string shaderSource(genShaderSourceMulExtended(ctx, s_shaders[shaderNdx], SHADER_FUNCTION_IMUL_EXTENDED, s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx2], s_intTypes[dataTypeNdx], s_intTypes[dataTypeNdx]));
					verifyShader(ctx, s_shaders[shaderNdx], shaderSource);
				}
			}
			ctx.endSection();
		}
	}
	ctx.endSection();
}